

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

_Bool parse_node_double_tuple_section
                (VrplibParser *p,Instance *instance,char *valuename,double *outarray)

{
  _Bool _Var1;
  _Bool _Var2;
  char *lexeme;
  ulong uVar3;
  int32_t i;
  uint uVar4;
  double value;
  double local_48;
  char *local_40;
  Instance *local_38;
  
  if (instance->num_customers == -1) {
    _Var2 = true;
  }
  else {
    _Var2 = true;
    uVar3 = 0;
    local_40 = valuename;
    local_38 = instance;
    do {
      uVar4 = 0;
      do {
        lexeme = get_token_lexeme(p);
        if (lexeme == (char *)0x0) {
          _Var2 = false;
        }
        else if ((uVar4 & 1) == 0) {
          _Var2 = parse_node_id(p,lexeme,(int32_t)uVar3);
        }
        else {
          local_48 = 0.0;
          _Var1 = str_to_double(lexeme,&local_48);
          if (_Var1) {
            outarray[uVar3] = local_48;
          }
          else {
            _Var2 = false;
            parse_error(p,"Expected valid double for %s",local_40);
          }
        }
        if (lexeme != (char *)0x0) {
          free(lexeme);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 == 1);
      _Var1 = parser_match_newline(p);
      if (!_Var1) {
        _Var2 = false;
        parse_error(p,"Expected newline after parsing node id `%d`",uVar3 & 0xffffffff);
      }
    } while ((_Var2 != false) && (uVar3 = uVar3 + 1, uVar3 != local_38->num_customers + 1));
  }
  return _Var2;
}

Assistant:

static bool parse_node_double_tuple_section(VrplibParser *p, Instance *instance,
                                            char *valuename, double *outarray) {
    bool result = true;

    for (int32_t node_id = 0;
         result && (node_id != (instance->num_customers + 1)); node_id++) {
        for (int32_t i = 0; i < 2; i++) {
            char *lexeme = get_token_lexeme(p);
            if (!lexeme) {
                result = false;
            } else {
                switch (i) {
                case 0:
                    result = parse_node_id(p, lexeme, node_id);
                    break;
                case 1: {
                    // Parse the value
                    double value = 0;
                    if (!str_to_double(lexeme, &value)) {
                        parse_error(p, "Expected valid double for %s",
                                    valuename);
                        result = false;
                    } else {
                        outarray[node_id] = value;
                    }
                    break;
                }
                }
            }

            if (lexeme) {
                free(lexeme);
            }
        }

        if (!parser_match_newline(p)) {
            parse_error(p, "Expected newline after parsing node id `%d`",
                        node_id);
            result = false;
        }
    }

    return result;
}